

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiz-spoil.c
# Opt level: O1

void spoil_obj_desc(char *fname)

{
  uint *puVar1;
  int iVar2;
  _Bool _Var3;
  void *p;
  size_t sVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  wchar_t i1;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  grouper *pgVar12;
  wchar_t e2;
  wchar_t e1;
  uint local_4fc;
  int32_t t2;
  int32_t t1;
  char *local_4f0;
  grouper *local_4e8;
  long local_4e0;
  char wgt [80];
  char dam [80];
  char buf [1024];
  
  path_build(buf,0x400,ANGBAND_DIR_USER,fname);
  fh = file_open(buf,MODE_WRITE,FTYPE_TEXT);
  if (fh != (ang_file *)0x0) {
    p = mem_zalloc((ulong)((uint)z_info->r_max * 2));
    file_putf(fh,"Spoiler File -- Basic Items (%s)\n\n\n",buildid);
    file_putf(fh,"%-51s  %7s%6s%4s%9s\n","Description","Dam/AC","Wgt","Lev","Cost");
    file_putf(fh,"%-51s  %7s%6s%4s%9s\n","----------------------------------------","------","---",
              "---","----");
    local_4e0 = 0;
    uVar6 = 0;
    do {
      pgVar12 = group_item + local_4e0;
      pcVar7 = group_item[local_4e0].name;
      if (pcVar7 != (char *)0x0) {
        local_4f0 = pcVar7;
        local_4e8 = pgVar12;
        if (1 < (int)uVar6) {
          local_4fc = uVar6 - 1;
          uVar8 = (ulong)local_4fc;
          uVar11 = 0;
          do {
            uVar9 = 0;
            do {
              kind_info((char *)0x0,0,(char *)0x0,0,(char *)0x0,0,&e1,&t1,
                        (uint)*(ushort *)((long)p + uVar9 * 2));
              kind_info((char *)0x0,0,(char *)0x0,0,(char *)0x0,0,&e2,&t2,
                        (uint)*(ushort *)((long)p + uVar9 * 2 + 2));
              if ((t2 < t1) || ((t1 == t2 && (e2 < e1)))) {
                puVar1 = (uint *)((long)p + uVar9 * 2);
                *puVar1 = *puVar1 << 0x10 | *puVar1 >> 0x10;
              }
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
            uVar11 = uVar11 + 1;
          } while (uVar11 != local_4fc);
        }
        if (0 < (int)uVar6) {
          uVar8 = 0;
          do {
            kind_info(buf,0x400,dam,0x50,wgt,0x50,&e1,&e2,(uint)*(ushort *)((long)p + uVar8 * 2));
            sVar4 = utf8_strlen(buf);
            if (sVar4 < 0x33) {
              file_putf(fh,"  %s%*s",buf,(ulong)(0x33 - (int)sVar4)," ");
            }
            else {
              if (sVar4 != 0x33) {
                utf8_clipto(buf,0x33);
              }
              file_putf(fh,"  %s",buf);
            }
            file_putf(fh,"%7s%6s%4d%9ld\n",dam,wgt);
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
        pgVar12 = local_4e8;
        if (local_4e8->tval == 0) goto LAB_001f403f;
        uVar6 = 0;
        file_putf(fh,"\n\n%s\n\n",local_4f0);
      }
      if (1 < z_info->k_max) {
        iVar2 = pgVar12->tval;
        uVar8 = 1;
        lVar10 = 0x325;
        do {
          if ((*(int *)((long)k_info + lVar10 + -0x61) == iVar2) &&
             (_Var3 = flag_has_dbg(k_info->flags + lVar10 + -0x80,2,4,"kind->kind_flags",
                                   "KF_INSTA_ART"), !_Var3)) {
            lVar5 = (long)(int)uVar6;
            uVar6 = uVar6 + 1;
            *(short *)((long)p + lVar5 * 2) = (short)uVar8;
          }
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + 0x2a0;
        } while (uVar8 < z_info->k_max);
      }
      local_4e0 = local_4e0 + 1;
    } while( true );
  }
  pcVar7 = "Cannot create spoiler file.";
LAB_001f4070:
  msg(pcVar7);
  return;
LAB_001f403f:
  mem_free(p);
  _Var3 = file_close(fh);
  pcVar7 = "Cannot close spoiler file.";
  if (_Var3) {
    pcVar7 = "Successfully created a spoiler file.";
  }
  goto LAB_001f4070;
}

Assistant:

void spoil_obj_desc(const char *fname)
{
	int i, k, s, t, n = 0;
	uint16_t *who;
	char buf[1024];
	char wgt[80];
	char dam[80];
	const char *format = "%-51s  %7s%6s%4s%9s\n";

	/* Open the file */
	path_build(buf, sizeof(buf), ANGBAND_DIR_USER, fname);
	fh = file_open(buf, MODE_WRITE, FTYPE_TEXT);

	/* Oops */
	if (!fh) {
		msg("Cannot create spoiler file.");
		return;
	}

	/* Allocate the "who" array */
	who = mem_zalloc(z_info->r_max * sizeof(uint16_t));

	/* Header */
	file_putf(fh, "Spoiler File -- Basic Items (%s)\n\n\n", buildid);

	/* More Header */
	file_putf(fh, format, "Description", "Dam/AC", "Wgt", "Lev", "Cost");
	file_putf(fh, format, "----------------------------------------",
	        "------", "---", "---", "----");

	/* List the groups */
	for (i = 0; true; i++) {
		/* Write out the group title */
		if (group_item[i].name) {
			/* Hack -- bubble-sort by cost and then level */
			for (s = 0; s < n - 1; s++) {
				for (t = 0; t < n - 1; t++) {
					int i1 = t;
					int i2 = t + 1;

					int e1;
					int e2;

					int32_t t1;
					int32_t t2;

					kind_info(NULL, 0, NULL, 0, NULL, 0, &e1, &t1, who[i1]);
					kind_info(NULL, 0, NULL, 0, NULL, 0, &e2, &t2, who[i2]);

					if ((t1 > t2) || ((t1 == t2) && (e1 > e2))) {
						int tmp = who[i1];
						who[i1] = who[i2];
						who[i2] = tmp;
					}
				}
			}

			/* Spoil each item */
			for (s = 0; s < n; s++) {
				int e;
				int32_t v;
				size_t u8len;

				/* Describe the kind */
				kind_info(buf, sizeof(buf), dam, sizeof(dam), wgt, sizeof(wgt),
						  &e, &v, who[s]);

				/* Dump it */
				/*
				 * Per C99, width specifications to %s measure
				 * bytes.  To align the columns if the
				 * description has characters that take
				 * multiple bytes, handle the first column
				 * separately.  If the description has
				 * decomposed characters (ones where multiple
				 * Unicode code points combine to form one
				 * printed character), the following columns
				 * will still be out of alignment, but they'll
				 * be closer to aligned than what the standard
				 * library functions would do.
				 */
				u8len = utf8_strlen(buf);
				if (u8len < 51) {
					file_putf(fh, "  %s%*s", buf,
						(int) (51 - u8len), " ");
				} else {
					if (u8len > 51) {
						utf8_clipto(buf, 51);
					}
					file_putf(fh, "  %s", buf);
				}
				file_putf(fh, "%7s%6s%4d%9ld\n", dam, wgt, e,
						  (long)(v));
			}

			/* Start a new set */
			n = 0;

			/* Notice the end */
			if (!group_item[i].tval) break;

			/* Start a new set */
			file_putf(fh, "\n\n%s\n\n", group_item[i].name);
		}

		/* Get legal item types */
		for (k = 1; k < z_info->k_max; k++) {
			struct object_kind *kind = &k_info[k];

			/* Skip wrong tvals */
			if (kind->tval != group_item[i].tval) continue;

			/* Hack -- Skip instant-artifacts */
			if (kf_has(kind->kind_flags, KF_INSTA_ART)) continue;

			/* Save the index */
			who[n++] = k;
		}
	}

	/* Free the "who" array */
	mem_free(who);

	/* Check for errors */
	if (!file_close(fh)) {
		msg("Cannot close spoiler file.");
		return;
	}

	/* Message */
	msg("Successfully created a spoiler file.");
}